

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O2

int __thiscall
TByteStream::GetArrayItemCount<char>(TByteStream *this,DWORD *ArraySize,DWORD *ItemCount)

{
  ulong *puVar1;
  ulong uVar2;
  int iVar3;
  DWORD DVar4;
  
  iVar3 = 1000;
  if (7 < this->cbByteData) {
    puVar1 = (ulong *)this->pbByteData;
    this->pbByteData = (LPBYTE)(puVar1 + 1);
    this->cbByteData = this->cbByteData - 8;
    uVar2 = *puVar1;
    if (uVar2 >> 0x20 == 0) {
      DVar4 = (DWORD)uVar2;
      *ItemCount = DVar4;
      *ArraySize = DVar4;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int GetBytes(size_t length, T ** Pointer)
    {
        // Is there enough bytes in the array?
        if(length > cbByteData)
            return ERROR_BAD_FORMAT;

        // Give the buffer to the caller
        Pointer[0] = (T *)(pbByteData);

        // Move pointers
        pbByteData += length;
        cbByteData -= length;
        return ERROR_SUCCESS;
    }